

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

tuple<const_int_*,_unsigned_int,_unsigned_int> __thiscall
immutable::rrb_region_for<int,false,6>
          (immutable *this,ref<immutable::rrb<int,_false,_6>_> *rrb,uint32_t index)

{
  uint32_t uVar1;
  rrb<int,_false,_6> *prVar2;
  leaf_node<int,_false> *plVar3;
  int *extraout_RDX;
  int *extraout_RDX_00;
  _Head_base<0UL,_const_int_*,_false> _Var4;
  tuple<const_int_*,_unsigned_int,_unsigned_int> tVar5;
  tuple<int_*,_unsigned_int,_unsigned_int> local_60;
  uint local_4c;
  uint local_48;
  uint32_t index_of_first_element;
  uint32_t subidx;
  uint32_t shift;
  internal_node<int,_false> *current;
  uint32_t original_index;
  uint local_20;
  uint32_t local_1c;
  uint32_t tail_offset;
  uint32_t index_local;
  ref<immutable::rrb<int,_false,_6>_> *rrb_local;
  
  local_1c = index;
  _tail_offset = rrb;
  rrb_local = (ref<immutable::rrb<int,_false,_6>_> *)this;
  prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
  if (index < prVar2->cnt) {
    prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_tail_offset);
    uVar1 = prVar2->cnt;
    prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_tail_offset);
    local_20 = uVar1 - prVar2->tail_len;
    if (local_1c < local_20) {
      current._4_4_ = local_1c;
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_tail_offset);
      _subidx = (internal_node<int,_false> *)(prVar2->root).ptr;
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_tail_offset);
      for (index_of_first_element = prVar2->shift; index_of_first_element != 0;
          index_of_first_element = index_of_first_element - 6) {
        if ((_subidx->size_table).ptr == (rrb_size_table<false> *)0x0) {
          local_48 = local_1c >> ((byte)index_of_first_element & 0x1f) & 0x3f;
          _subidx = _subidx->child[local_48].ptr;
        }
        else {
          _subidx = rrb_details::sized<int,false>(_subidx,&local_1c,index_of_first_element);
        }
      }
      local_4c = current._4_4_ - (local_1c & 0x3f);
      std::make_tuple<int*const&,unsigned_int_const&,unsigned_int>
                ((int **)&local_60,(uint *)&_subidx->size_table,&local_4c);
      std::tuple<const_int_*,_unsigned_int,_unsigned_int>::
      tuple<int_*,_unsigned_int,_unsigned_int,_true,_true>
                ((tuple<const_int_*,_unsigned_int,_unsigned_int> *)this,&local_60);
      _Var4._M_head_impl = extraout_RDX_00;
    }
    else {
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_tail_offset);
      plVar3 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&prVar2->tail);
      ref<immutable::rrb<int,_false,_6>_>::operator->(_tail_offset);
      std::make_tuple<int*&,unsigned_int_const&,unsigned_int&>
                ((int **)&stack0xffffffffffffffd0,(uint *)&plVar3->child,&local_20);
      std::tuple<const_int_*,_unsigned_int,_unsigned_int>::
      tuple<int_*,_unsigned_int,_unsigned_int,_true,_true>
                ((tuple<const_int_*,_unsigned_int,_unsigned_int> *)this,
                 (tuple<int_*,_unsigned_int,_unsigned_int> *)&stack0xffffffffffffffd0);
      _Var4._M_head_impl = extraout_RDX;
    }
    tVar5.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
    super__Head_base<0UL,_const_int_*,_false>._M_head_impl = _Var4._M_head_impl;
    tVar5.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> =
         (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)this;
    return (tuple<const_int_*,_unsigned_int,_unsigned_int>)
           tVar5.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>;
  }
  __assert_fail("index < rrb->cnt",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x7e0,
                "std::tuple<const T *, uint32_t, uint32_t> immutable::rrb_region_for(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t) [T = int, atomic_ref_counting = false, N = 6]"
               );
}

Assistant:

inline std::tuple<const T*, uint32_t, uint32_t> rrb_region_for(const ref<rrb<T, atomic_ref_counting, N>>& rrb, uint32_t index)
    {
    using namespace rrb_details;
    assert(index < rrb->cnt);
    const uint32_t tail_offset = rrb->cnt - rrb->tail_len;
    if (tail_offset <= index)
      {
      return std::make_tuple(rrb->tail->child, tail_offset, rrb->cnt);
      }
    else
      {
      const uint32_t original_index = index;
      const internal_node<T, atomic_ref_counting>* current = (const internal_node<T, atomic_ref_counting>*)rrb->root.ptr;
      for (uint32_t shift = rrb->shift; shift > 0; shift -= bits<N>::rrb_bits)
        {
        if (current->size_table.ptr == nullptr)
          {
          const uint32_t subidx = (index >> shift) & bits<N>::rrb_mask;
          current = current->child[subidx].ptr;
          }
        else
          {
          current = sized(current, &index, shift);
          }
        }
      const uint32_t index_of_first_element = original_index - (index & bits<N>::rrb_mask);
      return std::make_tuple(((const leaf_node<T, atomic_ref_counting>*)current)->child, index_of_first_element, index_of_first_element + ((const leaf_node<T, atomic_ref_counting>*)current)->len);
      }
    }